

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompressed.cpp
# Opt level: O2

CompressionFunction *
duckdb::UncompressedFun::GetFunction(CompressionFunction *__return_storage_ptr__,PhysicalType type)

{
  InternalException *this;
  uint uVar1;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  uVar1 = (uint)CONCAT71(in_register_00000031,type);
  if (((uVar1 < 0x18) && ((0xa01bfeU >> (uVar1 & 0x1f) & 1) != 0)) || (uVar1 - 0xcb < 2)) {
    FixedSizeUncompressed::GetFunction(__return_storage_ptr__,type);
  }
  else if (uVar1 == 200) {
    StringUncompressed::GetFunction(VARCHAR);
  }
  else {
    if (uVar1 != 0xce) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,"Unsupported type for Uncompressed",&local_39);
      InternalException::InternalException(this,&local_38);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ValidityUncompressed::GetFunction(BIT);
  }
  return __return_storage_ptr__;
}

Assistant:

CompressionFunction UncompressedFun::GetFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
	case PhysicalType::LIST:
	case PhysicalType::INTERVAL:
		return FixedSizeUncompressed::GetFunction(type);
	case PhysicalType::BIT:
		return ValidityUncompressed::GetFunction(type);
	case PhysicalType::VARCHAR:
		return StringUncompressed::GetFunction(type);
	default:
		throw InternalException("Unsupported type for Uncompressed");
	}
}